

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkStopTests(ARKodeMem ark_mem,sunrealtype tout,N_Vector yout,sunrealtype *tret,int itask,
                int *ier)

{
  sunrealtype sVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  sunrealtype *in_RDX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  int *in_R8;
  ARKodeMem in_XMM0_Qa;
  double dVar4;
  sunrealtype troundoff;
  int retval;
  int irfndp;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  dVar4 = in_RDI->uround * 100.0 * (ABS(in_RDI->tcur) + ABS(in_RDI->h));
  if ((in_RDI->root_mem != (ARKodeRootMem)0x0) && (0 < in_RDI->root_mem->nrtfn)) {
    iVar3 = in_RDI->root_mem->irfnd;
    if ((in_RDI->fn_is_current == 0) && (iVar3 != 0)) {
      iVar2 = (*in_RDI->step_fullrhs)(in_RDI,in_RDI->tn,in_RDI->yn,in_RDI->fn,1);
      if (iVar2 != 0) {
        arkProcessError(in_RDI,-8,0x841,"arkStopTests",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                       );
        *in_R8 = -8;
        return 1;
      }
      in_RDI->fn_is_current = 1;
    }
    iVar2 = arkRootCheck2(in_XMM0_Qa);
    if (iVar2 == 3) {
      arkProcessError((ARKodeMem)in_RDI->root_mem->tlo,(int)in_RDI,-0x16,(char *)0x84d,
                      "arkStopTests",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,"Root found at and very near t = %lg.");
      *in_R8 = -0x16;
      return 1;
    }
    if (iVar2 == -0xc) {
      arkProcessError((ARKodeMem)in_RDI->root_mem->tlo,(int)in_RDI,-0xc,(char *)0x854,"arkStopTests"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,"At t = %lg, the rootfinding routine failed in an unrecoverable manner.");
      *in_R8 = -0xc;
      return 1;
    }
    if (iVar2 == 1) {
      sVar1 = in_RDI->root_mem->tlo;
      *in_RDX = sVar1;
      in_RDI->tretlast = sVar1;
      *in_R8 = 2;
      return 1;
    }
    if (dVar4 < ABS(in_RDI->tcur - in_RDI->tretlast)) {
      iVar2 = arkRootCheck3(in_RDX);
      if (iVar2 == 0) {
        in_RDI->root_mem->irfnd = 0;
        if ((iVar3 == 1) && (in_ECX == 2)) {
          sVar1 = in_RDI->tcur;
          *in_RDX = sVar1;
          in_RDI->tretlast = sVar1;
          N_VScale(0x3ff0000000000000,in_RDI->yn,in_RSI);
          *in_R8 = 0;
          return 1;
        }
      }
      else {
        if (iVar2 == 1) {
          in_RDI->root_mem->irfnd = 1;
          sVar1 = in_RDI->root_mem->tlo;
          *in_RDX = sVar1;
          in_RDI->tretlast = sVar1;
          *in_R8 = 2;
          return 1;
        }
        if (iVar2 == -0xc) {
          arkProcessError((ARKodeMem)in_RDI->root_mem->tlo,(int)in_RDI,-0xc,(char *)0x87a,
                          "arkStopTests",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                          ,"At t = %lg, the rootfinding routine failed in an unrecoverable manner.")
          ;
          *in_R8 = -0xc;
          return 1;
        }
      }
    }
  }
  iVar3 = (int)((ulong)in_XMM0_Qa >> 0x20);
  if (in_RDI->tstopset != 0) {
    if (dVar4 < ABS(in_RDI->tcur - in_RDI->tstop)) {
      if (0.0 < ((in_RDI->tcur + in_RDI->hprime) - in_RDI->tstop) * in_RDI->h) {
        in_RDI->hprime = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
        in_RDI->eta = in_RDI->hprime / in_RDI->h;
      }
    }
    else if ((0.0 <= ((double)in_XMM0_Qa - in_RDI->tstop) * in_RDI->h) ||
            (ABS((double)in_XMM0_Qa - in_RDI->tstop) <= dVar4)) {
      if ((in_RDI->tstopinterp == 0) || (in_RDI->interp == (ARKInterp)0x0)) {
        N_VScale(0x3ff0000000000000,in_RDI->yn,in_RSI);
      }
      else {
        iVar3 = ARKodeGetDky((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (sunrealtype)in_RDI,iVar3,in_RSI);
        *in_R8 = iVar3;
        if (*in_R8 != 0) {
          arkProcessError((ARKodeMem)in_RDI->tstop,(int)in_RDI->tcur,(int)in_RDI,(char *)0xffffffea,
                          (char *)0x892,"arkStopTests",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                          ,
                          "The value tstop = %lg is behind current t = %lg in the direction of integration."
                         );
          *in_R8 = -0x16;
          return 1;
        }
      }
      sVar1 = in_RDI->tstop;
      *in_RDX = sVar1;
      in_RDI->tretlast = sVar1;
      in_RDI->tstopset = 0;
      *in_R8 = 1;
      return 1;
    }
  }
  if ((in_ECX != 1) || ((in_RDI->tcur - (double)in_XMM0_Qa) * in_RDI->h < 0.0)) {
    if ((in_ECX != 2) || (ABS(in_RDI->tcur - in_RDI->tretlast) <= dVar4)) {
      iVar3 = 0;
    }
    else {
      sVar1 = in_RDI->tcur;
      *in_RDX = sVar1;
      in_RDI->tretlast = sVar1;
      N_VScale(0x3ff0000000000000,in_RDI->yn,in_RSI);
      *in_R8 = 0;
      iVar3 = 1;
    }
  }
  else {
    if (in_RDI->interp == (ARKInterp)0x0) {
      N_VScale(0x3ff0000000000000,in_RDI->yn,in_RSI);
      sVar1 = in_RDI->tcur;
      *in_RDX = sVar1;
      in_RDI->tretlast = sVar1;
    }
    else {
      iVar3 = ARKodeGetDky((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (sunrealtype)in_RDI,iVar3,in_RSI);
      *in_R8 = iVar3;
      if (*in_R8 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_RDI,-0x16,(char *)0x8b1,"arkStopTests",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,
                        "Trouble interpolating at tout = %lg. tout too far back in direction of integration"
                       );
        *in_R8 = -0x16;
        return 1;
      }
      *in_RDX = (sunrealtype)in_XMM0_Qa;
      in_RDI->tretlast = (sunrealtype)in_XMM0_Qa;
    }
    *in_R8 = 0;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int arkStopTests(ARKodeMem ark_mem, sunrealtype tout, N_Vector yout,
                 sunrealtype* tret, int itask, int* ier)
{
  int irfndp, retval;
  sunrealtype troundoff;

  /* Estimate an infinitesimal time interval to be used as
     a roundoff for time quantities (based on current time
     and step size) */
  troundoff = FUZZ_FACTOR * ark_mem->uround *
              (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

  /* First, check for a root in the last step taken, other than the
     last root found, if any.  If itask = ARK_ONE_STEP and y(tn) was not
     returned because of an intervening root, return y(tn) now.     */
  if (ark_mem->root_mem != NULL)
  {
    if (ark_mem->root_mem->nrtfn > 0)
    {
      /* Shortcut to roots found in previous step */
      irfndp = ark_mem->root_mem->irfnd;

      /* If the full RHS was not computed in the last call to arkCompleteStep
         and roots were found in the previous step, then compute the full rhs
         for possible use in arkRootCheck2 (not always necessary) */
      if (!(ark_mem->fn_is_current) && irfndp != 0)
      {
        retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                       ark_mem->fn, ARK_FULLRHS_END);
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED);
          *ier = ARK_RHSFUNC_FAIL;
          return (1);
        }
        ark_mem->fn_is_current = SUNTRUE;
      }

      retval = arkRootCheck2((void*)ark_mem);

      if (retval == CLOSERT)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_CLOSE_ROOTS, ark_mem->root_mem->tlo);
        *ier = ARK_ILL_INPUT;
        return (1);
      }
      else if (retval == ARK_RTFUNC_FAIL)
      {
        arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
        *ier = ARK_RTFUNC_FAIL;
        return (1);
      }
      else if (retval == RTFOUND)
      {
        ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
        *ier                      = ARK_ROOT_RETURN;
        return (1);
      }

      /* If tn is distinct from tretlast (within roundoff),
         check remaining interval for roots */
      if (SUNRabs(ark_mem->tcur - ark_mem->tretlast) > troundoff)
      {
        retval = arkRootCheck3((void*)ark_mem);

        if (retval == ARK_SUCCESS)
        { /* no root found */
          ark_mem->root_mem->irfnd = 0;
          if ((irfndp == 1) && (itask == ARK_ONE_STEP))
          {
            ark_mem->tretlast = *tret = ark_mem->tcur;
            N_VScale(ONE, ark_mem->yn, yout);
            *ier = ARK_SUCCESS;
            return (1);
          }
        }
        else if (retval == RTFOUND)
        { /* a new root was found */
          ark_mem->root_mem->irfnd = 1;
          ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
          *ier                      = ARK_ROOT_RETURN;
          return (1);
        }
        else if (retval == ARK_RTFUNC_FAIL)
        { /* g failed */
          arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                          MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
          *ier = ARK_RTFUNC_FAIL;
          return (1);
        }
      }

    } /* end of root stop check */
  }

  /* Test for tn at tstop or near tstop */
  if (ark_mem->tstopset)
  {
    if (SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
    {
      /* Ensure tout >= tstop, otherwise check for tout return below */
      if ((tout - ark_mem->tstop) * ark_mem->h >= ZERO ||
          SUNRabs(tout - ark_mem->tstop) <= troundoff)
      {
        if (ark_mem->tstopinterp && ark_mem->interp)
        {
          *ier = ARKodeGetDky(ark_mem, ark_mem->tstop, 0, yout);
          if (*ier != ARK_SUCCESS)
          {
            arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                            MSG_ARK_BAD_TSTOP, ark_mem->tstop, ark_mem->tcur);
            *ier = ARK_ILL_INPUT;
            return (1);
          }
        }
        else { N_VScale(ONE, ark_mem->yn, yout); }
        ark_mem->tretlast = *tret = ark_mem->tstop;
        ark_mem->tstopset         = SUNFALSE;
        *ier                      = ARK_TSTOP_RETURN;
        return (1);
      }
    }
    /* If next step would overtake tstop, adjust stepsize */
    else if ((ark_mem->tcur + ark_mem->hprime - ark_mem->tstop) * ark_mem->h >
             ZERO)
    {
      ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
                        (ONE - FOUR * ark_mem->uround);
      ark_mem->eta = ark_mem->hprime / ark_mem->h;
    }
  }

  /* In ARK_NORMAL mode, test if tout was reached */
  if ((itask == ARK_NORMAL) && ((ark_mem->tcur - tout) * ark_mem->h >= ZERO))
  {
    if (ark_mem->interp)
    {
      *ier = ARKodeGetDky(ark_mem, tout, 0, yout);
      if (*ier != ARK_SUCCESS)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_BAD_TOUT, tout);
        *ier = ARK_ILL_INPUT;
        return (1);
      }
      ark_mem->tretlast = *tret = tout;
    }
    else
    {
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->tretlast = *tret = ark_mem->tcur;
    }
    *ier = ARK_SUCCESS;
    return (1);
  }

  /* In ARK_ONE_STEP mode, test if tn was returned */
  if (itask == ARK_ONE_STEP &&
      SUNRabs(ark_mem->tcur - ark_mem->tretlast) > troundoff)
  {
    ark_mem->tretlast = *tret = ark_mem->tcur;
    N_VScale(ONE, ark_mem->yn, yout);
    *ier = ARK_SUCCESS;
    return (1);
  }

  return (0);
}